

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O0

void __thiscall
burst::dynamic_tuple::
dynamic_tuple<std::__cxx11::string,int,double,std::vector<int,std::allocator<int>>,void>
          (dynamic_tuple *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *head,int *tail,
          double *tail_1,vector<int,_std::allocator<int>_> *tail_2)

{
  initializer_list<int> iVar1;
  int local_5c [3];
  iterator local_50;
  undefined8 local_48;
  vector<int,_std::allocator<int>_> *local_30;
  vector<int,_std::allocator<int>_> *tail_local_2;
  double *tail_local_1;
  int *tail_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *head_local;
  dynamic_tuple *this_local;
  
  this->m_capacity = 0x48;
  local_30 = tail_2;
  tail_local_2 = (vector<int,_std::allocator<int>_> *)tail_1;
  tail_local_1 = (double *)tail;
  tail_local = (int *)head;
  head_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::make_unique<signed_char[]>((size_t)&this->m_data);
  std::vector<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>::
  vector(&this->m_objects);
  this->m_volume = 0;
  push_back_no_realloc<std::__cxx11::string>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tail_local);
  push_back_no_realloc<int>(this,(int *)tail_local_1);
  local_5c[0] = 0;
  push_back_no_realloc<double>(this,(double *)tail_local_2);
  local_5c[1] = 0;
  push_back_no_realloc<std::vector<int,std::allocator<int>>>(this,local_30);
  local_5c[2] = 0;
  local_50 = local_5c;
  local_48 = 3;
  iVar1._M_len = 3;
  iVar1._M_array = local_50;
  burst::detail::dummy(iVar1);
  return;
}

Assistant:

explicit dynamic_tuple (Head && head, Tail && ... tail):
            m_capacity(aligned_volume_v<Head, Tail...>),
            m_data(std::make_unique<std::int8_t[]>(m_capacity))
        {
            try
            {
                push_back_no_realloc(std::forward<Head>(head));
                BURST_EXPAND_VARIADIC(push_back_no_realloc(std::forward<Tail>(tail)));
            }
            catch (...)
            {
                destroy_all();
                throw;
            }
        }